

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O2

void __thiscall
RangeLock_ExplicitInitialization_Test::~RangeLock_ExplicitInitialization_Test
          (RangeLock_ExplicitInitialization_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (RangeLock, ExplicitInitialization) {
    using ::testing::_;
    mock_file file;

    // These expectations are present to suppress a warning from clang about the member functions
    // being unused...
    EXPECT_CALL (file, close ()).Times (0);
    EXPECT_CALL (file, is_open_hook ()).Times (0);
    EXPECT_CALL (file, is_writable_hook ()).Times (0);
    EXPECT_CALL (file, path ()).Times (0);
    EXPECT_CALL (file, seek (_)).Times (0);
    EXPECT_CALL (file, tell ()).Times (0);
    EXPECT_CALL (file, read_buffer (_, _)).Times (0);
    EXPECT_CALL (file, write_buffer (_, _)).Times (0);
    EXPECT_CALL (file, size ()).Times (0);
    EXPECT_CALL (file, truncate (_)).Times (0);
    EXPECT_CALL (file, latest_time ()).Times (0);

    // Now the real test.
    EXPECT_CALL (file, lock (_, _, _, _)).Times (0);
    EXPECT_CALL (file, unlock (_, _)).Times (0);

    pstore::file::range_lock lock (&file,
                                   UINT64_C (5),   // offset
                                   std::size_t{7}, // size
                                   mock_file::lock_kind::exclusive_write);
    EXPECT_EQ (&file, lock.file ());
    EXPECT_EQ (UINT64_C (5), lock.offset ());
    EXPECT_EQ (std::size_t{7}, lock.size ());
    EXPECT_EQ (mock_file::lock_kind::exclusive_write, lock.kind ());
    EXPECT_FALSE (lock.is_locked ());
}